

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O3

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  pointer *pppFVar1;
  uint *puVar2;
  byte *pbVar3;
  iterator __position;
  int iVar4;
  byte bVar5;
  int iVar6;
  Face *pFVar7;
  Model *pMVar8;
  Logger *pLVar9;
  byte *pbVar10;
  runtime_error *this_00;
  int iVar11;
  Material *pMVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  IndexArray *pIVar16;
  Mesh *pMVar17;
  uint uVar18;
  byte *pbVar19;
  ulong uVar20;
  Face *face;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  IndexArray *local_60;
  IndexArray *local_58;
  IndexArray *local_50;
  Face *local_48;
  pointer local_40;
  pointer local_38;
  
  pbVar19 = (byte *)(this->m_DataIt)._M_current;
  pbVar3 = (byte *)(this->m_DataItEnd)._M_current;
  pbVar10 = pbVar3 + -1;
  if (pbVar10 != pbVar19 && pbVar19 != pbVar3) {
    do {
      if (((ulong)*pbVar19 < 0x21) && ((0x100003601U >> ((ulong)*pbVar19 & 0x3f) & 1) != 0))
      goto LAB_0047146d;
      pbVar19 = pbVar19 + 1;
    } while ((pbVar19 != pbVar3) && (pbVar19 != pbVar10));
  }
LAB_0047147c:
  (this->m_DataIt)._M_current = (char *)pbVar19;
  if ((pbVar19 != pbVar3) && (*pbVar19 != 0)) {
    pFVar7 = (Face *)operator_new(0x58);
    pFVar7->m_PrimitiveType = type;
    local_50 = &pFVar7->m_vertices;
    (pFVar7->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar7->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar7->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pFVar7->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar7->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar7->m_normals).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pFVar7->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (pFVar7->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (pFVar7->m_texturCoords).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar7->m_pMaterial = (Material *)0x0;
    pMVar8 = (this->m_pModel)._M_t.
             super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
             .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
    local_68 = (int)((ulong)((long)*(pointer *)
                                    ((long)&(pMVar8->m_Vertices).
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    + 8) -
                            *(long *)&(pMVar8->m_Vertices).
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl) >> 2) * -0x55555555;
    local_38 = *(pointer *)
                ((long)&(pMVar8->m_TextureCoord).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> +
                8);
    local_40 = *(pointer *)
                &(pMVar8->m_TextureCoord).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl;
    local_6c = (int)((ulong)((long)local_38 - (long)local_40) >> 2) * -0x55555555;
    uVar13 = (long)*(pointer *)
                    ((long)&(pMVar8->m_Normals).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                    + 8) -
             *(long *)&(pMVar8->m_Normals).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl;
    local_70 = (int)(uVar13 >> 2) * -0x55555555;
    local_64 = (uVar13 != 0) + 1;
    local_58 = &pFVar7->m_normals;
    local_60 = &pFVar7->m_texturCoords;
    bVar5 = 0;
    iVar14 = 0;
    local_48 = pFVar7;
    do {
      uVar13 = (ulong)*pbVar19;
      if (uVar13 < 0x30) {
        uVar20 = 1;
        if ((0x100000200U >> (uVar13 & 0x3f) & 1) == 0) {
          if (uVar13 != 0x2f) {
            if ((0x3401UL >> (uVar13 & 0x3f) & 1) == 0) goto LAB_004715c6;
            break;
          }
          if (type == aiPrimitiveType_POINT) {
            pLVar9 = DefaultLogger::get();
            Logger::error(pLVar9,"Obj: Separator unexpected in point statement");
          }
          iVar15 = iVar14 + 1;
        }
        else {
          iVar15 = 0;
        }
      }
      else {
LAB_004715c6:
        iVar6 = atoi((char *)pbVar19);
        uVar18 = -(iVar6 >> 0x1f);
        iVar11 = iVar6;
        for (iVar15 = iVar6; uVar18 = uVar18 + 1, 0x12 < iVar15 + 9U; iVar15 = iVar15 - iVar4) {
          iVar4 = iVar11 >> 0x1f;
          iVar15 = iVar11 / 10 + iVar4;
          iVar11 = iVar15 - iVar4;
        }
        iVar15 = local_64;
        if (iVar14 != 1) {
          iVar15 = iVar14;
        }
        if (local_40 != local_38) {
          iVar15 = iVar14;
        }
        pIVar16 = local_60;
        if (iVar6 < 1) {
          if (-1 < iVar6) {
            ObjFile::Face::~Face(pFVar7);
            operator_delete(pFVar7,0x58);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,"OBJ: Invalid face indice","");
            std::runtime_error::runtime_error(this_00,(string *)local_90);
            *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (iVar15 != 2) {
            if (iVar15 == 1) {
              iVar6 = iVar6 + local_6c;
            }
            else {
              if (iVar15 != 0) goto LAB_00471660;
              iVar6 = iVar6 + local_68;
              pIVar16 = local_50;
            }
            goto LAB_0047167f;
          }
          iVar6 = iVar6 + local_70;
LAB_0047168f:
          local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,iVar6);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    (local_58,(uint *)local_90);
          bVar5 = 1;
        }
        else {
          if (iVar15 == 2) {
            iVar6 = iVar6 + -1;
            goto LAB_0047168f;
          }
          if (iVar15 == 1) {
            iVar6 = iVar6 + -1;
LAB_0047167f:
            local_90[0] = (undefined1 *)CONCAT44(local_90[0]._4_4_,iVar6);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (pIVar16,(uint *)local_90);
          }
          else {
            if (iVar15 == 0) {
              iVar6 = iVar6 + -1;
              pIVar16 = local_50;
              goto LAB_0047167f;
            }
LAB_00471660:
            reportErrorTokenInFace(this);
          }
        }
        uVar20 = (ulong)uVar18;
      }
      pbVar19 = (byte *)((this->m_DataIt)._M_current + uVar20);
      (this->m_DataIt)._M_current = (char *)pbVar19;
      iVar14 = iVar15;
    } while (pbVar19 != (byte *)(this->m_DataItEnd)._M_current);
    if ((pFVar7->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (pFVar7->m_vertices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pLVar9 = DefaultLogger::get();
      Logger::error(pLVar9,"Obj: Ignoring empty face");
      pFVar7 = local_48;
      pbVar10 = (byte *)(this->m_DataIt)._M_current;
      pbVar19 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar19 + -1 != pbVar10 && pbVar10 != pbVar19) {
        do {
          if (((*pbVar10 < 0xe) && ((0x3401U >> (*pbVar10 & 0x1f) & 1) != 0)) ||
             (pbVar10 = pbVar10 + 1, pbVar10 == pbVar19)) break;
        } while (pbVar10 != pbVar19 + -1);
      }
      pbVar3 = pbVar10;
      if (pbVar10 != pbVar19) {
        pbVar10 = pbVar10 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar3 = pbVar10;
      }
      for (; (pbVar3 != pbVar19 && ((*pbVar3 == 0x20 || (pbVar10 = pbVar3, *pbVar3 == 9))));
          pbVar3 = pbVar3 + 1) {
        pbVar10 = pbVar19;
      }
      (this->m_DataIt)._M_current = (char *)pbVar10;
      if (local_48 != (Face *)0x0) {
        ObjFile::Face::~Face(local_48);
      }
      operator_delete(pFVar7,0x58);
    }
    else {
      pMVar8 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      pMVar12 = pMVar8->m_pCurrentMaterial;
      if (pMVar12 == (Material *)0x0) {
        pMVar12 = pMVar8->m_pDefaultMaterial;
      }
      pFVar7->m_pMaterial = pMVar12;
      if (pMVar8->m_pCurrent == (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar8 = (this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      }
      pMVar17 = pMVar8->m_pCurrentMesh;
      if (pMVar17 == (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
        pMVar17 = ((this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                  m_pCurrentMesh;
      }
      __position._M_current =
           *(pointer *)
            ((long)&(pMVar17->m_Faces).
                    super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                    ._M_impl + 8);
      if (__position._M_current ==
          *(pointer *)
           ((long)&(pMVar17->m_Faces).
                   super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                   ._M_impl + 0x10)) {
        std::vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>>::
        _M_realloc_insert<Assimp::ObjFile::Face*const&>
                  ((vector<Assimp::ObjFile::Face*,std::allocator<Assimp::ObjFile::Face*>> *)
                   &pMVar17->m_Faces,__position,&local_48);
      }
      else {
        *__position._M_current = pFVar7;
        pppFVar1 = (pointer *)
                   ((long)&(pMVar17->m_Faces).
                           super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                           ._M_impl + 8);
        *pppFVar1 = *pppFVar1 + 1;
        local_48 = pFVar7;
      }
      puVar2 = &((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh->m_uiNumIndices;
      *puVar2 = *puVar2 + (int)((ulong)((long)(local_48->m_vertices).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_48->m_vertices).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar2 = ((this->m_pModel)._M_t.
                super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                ._M_t.
                super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
               m_pCurrentMesh->m_uiUVCoordinates;
      *puVar2 = *puVar2 + (int)((ulong)((long)(local_48->m_texturCoords).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_48->m_texturCoords).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2);
      pMVar17 = ((this->m_pModel)._M_t.
                 super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                 .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                m_pCurrentMesh;
      if (((~bVar5 | pMVar17->m_hasNormals) & 1) == 0) {
        pMVar17->m_hasNormals = true;
      }
      pbVar10 = (byte *)(this->m_DataIt)._M_current;
      pbVar19 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar19 + -1 != pbVar10 && pbVar10 != pbVar19) {
        while ((0xd < *pbVar10 || ((0x3401U >> (*pbVar10 & 0x1f) & 1) == 0))) {
          pbVar10 = pbVar10 + 1;
          if ((pbVar10 == pbVar19) || (pbVar10 == pbVar19 + -1)) break;
        }
      }
      pbVar3 = pbVar10;
      if (pbVar10 != pbVar19) {
        pbVar10 = pbVar10 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar3 = pbVar10;
      }
      for (; (pbVar3 != pbVar19 && ((*pbVar3 == 0x20 || (pbVar10 = pbVar3, *pbVar3 == 9))));
          pbVar3 = pbVar3 + 1) {
        pbVar10 = pbVar19;
      }
      (this->m_DataIt)._M_current = (char *)pbVar10;
    }
  }
  return;
LAB_0047146d:
  if ((*pbVar19 != 0x20) && (*pbVar19 != 9)) goto LAB_0047147c;
  pbVar19 = pbVar19 + 1;
  if ((pbVar19 == pbVar3) || (pbVar19 == pbVar10)) goto LAB_0047147c;
  goto LAB_0047146d;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}